

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlHandle __thiscall
despot::util::tinyxml::TiXmlHandle::Child(TiXmlHandle *this,char *value,int count)

{
  int in_ECX;
  undefined4 in_register_00000014;
  TiXmlNode *local_30;
  TiXmlNode *child;
  int i;
  int count_local;
  char *value_local;
  TiXmlHandle *this_local;
  
  if (*(long *)value != 0) {
    local_30 = TiXmlNode::FirstChild
                         (*(TiXmlNode **)value,(char *)CONCAT44(in_register_00000014,count));
    for (child._0_4_ = 0; local_30 != (TiXmlNode *)0x0 && (int)child < in_ECX;
        child._0_4_ = (int)child + 1) {
      local_30 = TiXmlNode::NextSibling(local_30,(char *)CONCAT44(in_register_00000014,count));
    }
    if (local_30 != (TiXmlNode *)0x0) {
      TiXmlHandle(this,local_30);
      return (TiXmlHandle)(TiXmlNode *)this;
    }
  }
  TiXmlHandle(this,(TiXmlNode *)0x0);
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::Child(const char* value, int count) const {
	if (node) {
		int i;
		TiXmlNode* child = node->FirstChild(value);
		for (i = 0; child && i < count;
			child = child->NextSibling(value), ++i) {
			// nothing
		}
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}